

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::to_tesc_invocation_id_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this)

{
  SPIREntryPoint *pSVar1;
  uint *in_R8;
  string local_38;
  CompilerMSL *local_18;
  CompilerMSL *this_local;
  
  local_18 = this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  if (((this->msl_options).multi_patch_workgroup & 1U) == 0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              (__return_storage_ptr__,this,8,1);
  }
  else {
    CompilerGLSL::to_expression_abi_cxx11_
              (&local_38,&this->super_CompilerGLSL,this->builtin_invocation_id_id,true);
    pSVar1 = Compiler::get_entry_point((Compiler *)this);
    join<std::__cxx11::string,char_const(&)[6],unsigned_int&>
              (__return_storage_ptr__,(spirv_cross *)&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".x % ",
               (char (*) [6])&pSVar1->output_vertices,in_R8);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_tesc_invocation_id()
{
	if (msl_options.multi_patch_workgroup)
	{
		// n.b. builtin_invocation_id_id here is the dispatch global invocation ID,
		// not the TC invocation ID.
		return join(to_expression(builtin_invocation_id_id), ".x % ", get_entry_point().output_vertices);
	}
	else
		return builtin_to_glsl(BuiltInInvocationId, StorageClassInput);
}